

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref cashew::ValueBuilder::makePtrShift(Ref ptr,int shifts)

{
  size_t sVar1;
  Value *this;
  Ref RVar2;
  void *__ptr;
  Ref in_R8;
  IString op;
  
  sVar1 = DAT_010d1860;
  RVar2.inst = RSHIFT.inst;
  __ptr = (void *)0x18;
  this = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  this->type = Null;
  cashew::Value::free(this,__ptr);
  this->type = Number;
  (this->field_1).num = (double)shifts;
  op.str._M_str = (char *)this;
  op.str._M_len = sVar1;
  RVar2 = makeBinary(ptr.inst,RVar2,op,in_R8);
  return (Ref)RVar2.inst;
}

Assistant:

static Ref makePtrShift(Ref ptr, int shifts) {
    return makeBinary(ptr, RSHIFT, makeInt(shifts));
  }